

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnAtomicRmwCmpxchg
          (SharedValidator *this,Location *loc,Opcode opcode,Var *memidx,Address alignment,
          Address offset)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  byte bVar4;
  bool bVar5;
  MemoryType mt;
  Opcode local_e8;
  Enum local_e4;
  Address local_e0;
  Limits local_d8;
  Var local_c0;
  Info local_78;
  
  local_e8.enum_ = opcode.enum_;
  local_e0 = alignment;
  local_e4 = (Enum)CheckInstr(this,opcode,loc);
  local_d8.initial = 0;
  local_d8.max._0_7_ = 0;
  local_d8.max._7_1_ = 0;
  local_d8.has_max = false;
  local_d8.is_shared = false;
  local_d8.is_64 = false;
  Var::Var(&local_c0,memidx);
  RVar1 = CheckMemoryIndex(this,&local_c0,(MemoryType *)&local_d8);
  Var::~Var(&local_c0);
  Opcode::GetInfo(&local_78,&local_e8);
  RVar2 = CheckAtomicAlign(this,loc,local_e0,local_78.memory_size);
  bVar4 = offset >> 0x20 == 0 | local_d8.is_64;
  if (bVar4 == 0) {
    PrintError(this,loc,"offset must be less than or equal to 0xffffffff");
  }
  bVar5 = local_e4 == Error;
  RVar3 = TypeChecker::OnAtomicRmwCmpxchg(&this->typechecker_,local_e8,&local_d8);
  RVar1.enum_._0_1_ =
       RVar3.enum_ == Error | (RVar2.enum_ == Error || (RVar1.enum_ == Error || bVar5)) | bVar4 ^ 1;
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnAtomicRmwCmpxchg(const Location& loc,
                                           Opcode opcode,
                                           Var memidx,
                                           Address alignment,
                                           Address offset) {
  Result result = CheckInstr(opcode, loc);
  MemoryType mt;
  result |= CheckMemoryIndex(memidx, &mt);
  result |= CheckAtomicAlign(loc, alignment, opcode.GetMemorySize());
  result |= CheckOffset(loc, offset, mt.limits);
  result |= typechecker_.OnAtomicRmwCmpxchg(opcode, mt.limits);
  return result;
}